

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalogManager.cpp
# Opt level: O3

int __thiscall catalog::existTable(catalog *this,string *tableName)

{
  int iVar1;
  pointer ppTVar2;
  size_t __n;
  TableInfo *pTVar3;
  int iVar4;
  long lVar5;
  
  iVar1 = this->tableNumber;
  if (0 < (long)iVar1) {
    ppTVar2 = (this->TableInfoList).super__Vector_base<TableInfo_*,_std::allocator<TableInfo_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    __n = tableName->_M_string_length;
    lVar5 = 0;
    do {
      pTVar3 = ppTVar2[lVar5];
      if (((pTVar3->tableName)._M_string_length == __n) &&
         ((__n == 0 ||
          (iVar4 = bcmp((pTVar3->tableName)._M_dataplus._M_p,(tableName->_M_dataplus)._M_p,__n),
          iVar4 == 0)))) {
        return (int)lVar5;
      }
      lVar5 = lVar5 + 1;
    } while (iVar1 != lVar5);
  }
  return -1;
}

Assistant:

int catalog::existTable(std::string tableName){
    for(int i = 0 ; i < tableNumber ; i++){
        // std::cout << "check "<<tableName<<std::endl;
        // std::cout << "find "<<TableInfoList[i]->tableName<<std::endl;
        if(TableInfoList[i]->tableName == tableName){
            return i;
        }
    }
    return -1;
}